

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O2

void __thiscall MetaDCEGraph::scanWebAssembly(MetaDCEGraph *this)

{
  Export *__k;
  anon_class_8_1_8991fb9c aVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  pointer puVar5;
  MetaDCEGraph *in_RCX;
  pointer puVar6;
  __node_base this_00;
  anon_class_16_2_51b3ad0a visitor;
  anon_class_16_2_6cd5bbc8 visitor_00;
  PassRunner local_3a8 [8];
  PassRunner runner;
  undefined1 auStack_2b8 [8];
  Name dceName;
  _Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
  local_208;
  char *pcStack_1f0;
  Module *local_1e8;
  MetaDCEGraph *local_1e0;
  pointer local_1d8;
  __uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> _Stack_1d0;
  undefined1 local_1c0 [24];
  pointer pbStack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [17];
  string local_88;
  string local_68;
  pointer local_48;
  __node_base local_40;
  anon_class_8_1_8991fb9c local_38;
  
  wasm::ModuleUtils::
  iterModuleItems<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::ModuleItemKind,wasm::Named*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  puVar5 = (this->wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00._M_nxt = (_Hash_node_base *)&this->exportToDCENode;
  local_48 = puVar5;
  local_40._M_nxt = this_00._M_nxt;
  local_38.this = this;
  for (puVar6 = (this->wasm->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; aVar1.this = local_38.this,
      puVar6 != puVar5; puVar6 = puVar6 + 1) {
    __k = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (__k[0x28] == (Export)0x0) {
      iVar2 = std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00._M_nxt,(key_type *)__k);
      if (iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur ==
          (__node_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"export",(allocator<char> *)local_1c0);
        wasm::IString::toString_abi_cxx11_
                  (&local_68,
                   (IString *)
                   (puVar6->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        _auStack_2b8 = (string_view)getName(local_38.this,&local_88,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        pmVar3 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00._M_nxt,
                              (key_type *)
                              (puVar6->_M_t).
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        (pmVar3->super_IString).str._M_len = (size_t)auStack_2b8;
        (pmVar3->super_IString).str._M_str = (char *)dceName.super_IString.str._M_len;
        local_1c0._0_8_ = auStack_2b8;
        local_1c0._8_8_ = dceName.super_IString.str._M_len;
        local_1c0._16_8_ = (pointer)0x0;
        pbStack_1a8 = (pointer)0x0;
        local_1a0[0]._M_allocated_capacity = (Module *)0x0;
        pmVar4 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_38.this,(key_type *)auStack_2b8);
        DCENode::operator=(pmVar4,(DCENode *)local_1c0);
        std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                  ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)(local_1c0 + 0x10));
      }
      pmVar3 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00._M_nxt,
                            (key_type *)
                            (puVar6->_M_t).
                            super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                            .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
      aVar1.this = local_38.this;
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_38.this,pmVar3);
      in_RCX = (MetaDCEGraph *)(((IString *)&__k[0x20].field_0x0)->str)._M_len;
      local_1c0._0_16_ =
           (undefined1  [16])
           getDCEName(aVar1.this,
                      *(ModuleItemKind *)
                       ((puVar6->_M_t).
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x10),
                      (IString)*(IString *)(__k + 0x18));
      this_00._M_nxt = local_40._M_nxt;
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
                (&pmVar4->reaches,(Name *)local_1c0);
      puVar5 = local_48;
    }
  }
  wasm::ModuleUtils::iterDefinedGlobals<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::Global*)_1_>
            ((local_38.this)->wasm,local_38);
  _auStack_2b8 = (string_view)ZEXT816(0);
  local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_1f0 = (char *)0x0;
  local_1e0 = aVar1.this;
  local_1d8 = (pointer)0x0;
  _Stack_1d0._M_t.
  super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
  super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl =
       (tuple<wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>)
       (_Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>)0x0;
  local_1e8 = (aVar1.this)->wasm;
  visitor.rooter = (InitScanner *)in_RCX;
  visitor.this = (MetaDCEGraph *)auStack_2b8;
  wasm::ModuleUtils::
  iterActiveElementSegments<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::ElementSegment*)_1_>
            ((ModuleUtils *)local_1e8,(Module *)aVar1.this,visitor);
  visitor_00.this = in_RCX;
  visitor_00.rooter = (InitScanner *)local_38.this;
  wasm::ModuleUtils::
  iterActiveDataSegments<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::DataSegment*)_1_>
            ((ModuleUtils *)(local_38.this)->wasm,(Module *)auStack_2b8,visitor_00);
  aVar1.this = local_38.this;
  wasm::PassRunner::PassRunner(local_3a8,(local_38.this)->wasm);
  scanWebAssembly::Scanner::Scanner((Scanner *)local_1c0,aVar1.this);
  wasm::WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
              *)local_1c0,local_3a8,(local_38.this)->wasm);
  wasm::WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>::
  ~WalkerPass((WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
               *)local_1c0);
  wasm::PassRunner::~PassRunner(local_3a8);
  std::
  _Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
  ::~_Vector_base(&local_208);
  return;
}

Assistant:

void scanWebAssembly() {
    // Add an entry for everything we might need ahead of time, so parallel work
    // does not alter parent state, just adds to things pointed by it,
    // independently (each thread will add for one function, etc.)
    ModuleUtils::iterModuleItems(wasm, [&](ModuleItemKind kind, Named* item) {
      if (auto* import = wasm.getImportOrNull(kind, item->name)) {
        auto id = getImportId(import->module, import->base);
        if (importIdToDCENode.find(id) == importIdToDCENode.end()) {
          auto dceName = getName("importId", import->name.toString());
          importIdToDCENode[id] = dceName;
        }
        return;
      }
      auto dceName = getName(kindPrefixes[kind], item->name.toString());
      itemToDCENode[{kind, item->name}] = dceName;
      nodes[dceName] = DCENode(dceName);
    });
    for (auto& exp : wasm.exports) {
      // skip type exports
      // TODO: shall we keep track of type dependencies?
      if (auto* name = exp->getInternalName()) {
        if (exportToDCENode.find(exp->name) == exportToDCENode.end()) {
          auto dceName = getName("export", exp->name.toString());
          exportToDCENode[exp->name] = dceName;
          nodes[dceName] = DCENode(dceName);
        }
        // we can also link the export to the thing being exported
        auto& node = nodes[exportToDCENode[exp->name]];
        node.reaches.push_back(getDCEName(ModuleItemKind(exp->kind), *name));
      }
    }
    // Add initializer dependencies
    // if we provide a parent DCE name, that is who can reach what we see
    // if none is provided, then it is something we must root
    struct InitScanner : public PostWalker<InitScanner> {
      InitScanner(MetaDCEGraph* parent, Name parentDceName)
        : parent(parent), parentDceName(parentDceName) {}

      void visitGlobalGet(GlobalGet* curr) { handleGlobal(curr->name); }
      void visitGlobalSet(GlobalSet* curr) { handleGlobal(curr->name); }
      void visitRefFunc(RefFunc* curr) {
        assert(!parentDceName.isNull());
        parent->nodes[parentDceName].reaches.push_back(
          parent->getDCEName(ModuleItemKind::Function, curr->func));
      }

    private:
      MetaDCEGraph* parent;
      Name parentDceName;

      void handleGlobal(Name name) {
        Name dceName;
        if (!getModule()->getGlobal(name)->imported()) {
          // its a defined global
          dceName = parent->itemToDCENode[{ModuleItemKind::Global, name}];
        } else {
          // it's an import.
          dceName = parent->importIdToDCENode[parent->getImportId(
            ModuleItemKind::Global, name)];
        }
        if (parentDceName.isNull()) {
          parent->roots.insert(dceName);
        } else {
          parent->nodes[parentDceName].reaches.push_back(dceName);
        }
      }
    };
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      InitScanner scanner(
        this, itemToDCENode[{ModuleItemKind::Global, global->name}]);
      scanner.setModule(&wasm);
      scanner.walk(global->init);
    });
    // We can't remove active segments, so root them and what they use.
    // TODO: treat them as in a cycle with their parent memory/table
    InitScanner rooter(this, Name());
    rooter.setModule(&wasm);
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      // TODO: currently, all functions in the table are roots, but we
      //       should add an option to refine that
      ElementUtils::iterElementSegmentFunctionNames(
        segment, [&](Name name, Index) {
          roots.insert(getDCEName(ModuleItemKind::Function, name));
        });
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::ElementSegment, segment->name));
    });
    ModuleUtils::iterActiveDataSegments(wasm, [&](DataSegment* segment) {
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::DataSegment, segment->name));
    });

    // A parallel scanner for function bodies
    struct Scanner : public WalkerPass<
                       PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>>> {
      bool isFunctionParallel() override { return true; }

      Scanner(MetaDCEGraph* parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Scanner>(parent);
      }

      void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    handle(kind, cast->field);                                                 \
  }

#include "wasm-delegations-fields.def"
      }

    private:
      MetaDCEGraph* parent;

      void handle(ModuleItemKind kind, Name name) {
        getCurrentFunctionDCENode().reaches.push_back(
          parent->getDCEName(kind, name));
      }

      DCENode& getCurrentFunctionDCENode() {
        return parent->nodes[parent->itemToDCENode[{ModuleItemKind::Function,
                                                    getFunction()->name}]];
      }
    };

    PassRunner runner(&wasm);
    Scanner(this).run(&runner, &wasm);
  }